

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

LY_ERR lyd_diff_add(lyd_node *node,lyd_diff_op op,char *orig_default,char *orig_value,char *key,
                   char *value,char *position,char *orig_key,char *orig_position,lyd_node **diff)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  lysc_node *plVar4;
  lyd_node *plVar5;
  LY_ERR LVar6;
  uint32_t uVar7;
  int iVar8;
  lyd_node *plVar9;
  char *pcVar10;
  lyd_node_inner *plVar11;
  lys_module *plVar12;
  char *name;
  lyd_node_inner *plVar13;
  lyd_node_inner *plVar14;
  lyd_diff_op op_00;
  lyd_node_inner *plVar15;
  lyd_node *dup;
  lyd_diff_op local_84;
  char *local_80;
  lyd_node *match;
  lyd_diff_op cur_op;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  lyd_meta *meta;
  size_t bufused;
  size_t buflen;
  
  match = (lyd_node *)0x0;
  if (diff == (lyd_node **)0x0) {
    __assert_fail("diff",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x141,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  plVar4 = node->schema;
  uVar1 = plVar4->nodetype;
  if (op == LYD_DIFF_OP_REPLACE && uVar1 == 4) {
    if ((orig_default == (char *)0x0) || (orig_value == (char *)0x0)) {
      __assert_fail("(node->schema->nodetype != LYS_LEAF) || (op != LYD_DIFF_OP_REPLACE) || (orig_default && orig_value)"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                    ,0x144,
                    "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                   );
    }
  }
  else if (uVar1 == 8) {
    uVar2 = plVar4->flags;
    if ((op == LYD_DIFF_OP_CREATE) && ((uVar2 & 0x40) != 0)) {
      if ((value == (char *)0x0) && (position == (char *)0x0 || (uVar2 & 1) != 0)) {
        __assert_fail("(node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || value"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x14a,
                      "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                     );
      }
    }
    else if (((op == LYD_DIFF_OP_REPLACE) && ((uVar2 & 0x40) != 0)) &&
            ((((orig_position == (char *)0x0 || (position == (char *)0x0)) || ((uVar2 & 1) != 0)) &&
             ((orig_value == (char *)0x0 || (value == (char *)0x0)))))) {
      __assert_fail("(node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (value && orig_value)"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                    ,0x151,
                    "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                   );
    }
  }
  else if (uVar1 == 0x10) {
    uVar2 = plVar4->flags;
    if ((op == LYD_DIFF_OP_CREATE) && ((uVar2 & 0x40) != 0)) {
      if ((uVar2 >> 9 & 1) == 0) {
        if (key == (char *)0x0) {
LAB_00116477:
          __assert_fail("(node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || key"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                        ,0x148,
                        "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                       );
        }
      }
      else if (key == (char *)0x0 && position == (char *)0x0) goto LAB_00116477;
    }
    else if (((op == LYD_DIFF_OP_REPLACE) && ((uVar2 & 0x40) != 0)) &&
            ((((uVar2 >> 9 & 1) == 0 || (position == (char *)0x0 || orig_position == (char *)0x0))
             && ((key == (char *)0x0 || (orig_key == (char *)0x0)))))) {
      __assert_fail("(node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (key && orig_key)"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                    ,0x14e,
                    "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                   );
    }
  }
  plVar9 = *diff;
  plVar13 = (lyd_node_inner *)node;
  local_50 = orig_default;
  local_58 = orig_value;
  local_60 = key;
  local_68 = value;
  local_84 = op;
  plVar14 = (lyd_node_inner *)0x0;
LAB_00115d9e:
  do {
    plVar11 = plVar13;
    plVar13 = *(lyd_node_inner **)((long)&plVar11->field_0 + 0x10);
    if (plVar13 != (lyd_node_inner *)0x0) {
      if ((plVar14 == (lyd_node_inner *)0x0) ||
         ((plVar13->field_0).node.schema != (plVar14->field_0).node.schema)) goto LAB_00115d9e;
    }
    plVar4 = (plVar11->field_0).node.schema;
    if (plVar4 != (lysc_node *)0x0) {
      if (plVar4->nodetype == 8) {
        if ((plVar4->flags & 1) == 0) goto LAB_00116096;
      }
      else if ((plVar4->nodetype == 0x10) && ((plVar4->flags & 0x200) != 0)) {
LAB_00116096:
        match = (lyd_node *)0x0;
        goto LAB_0011609c;
      }
    }
    LVar6 = lyd_find_sibling_first(plVar9,(lyd_node *)plVar11,&match);
    plVar5 = match;
    if ((LVar6 != LY_SUCCESS) ||
       (plVar9 = lyd_child_no_keys(match), plVar13 = (lyd_node_inner *)node,
       plVar14 = (lyd_node_inner *)plVar5, plVar11 == (lyd_node_inner *)node)) break;
  } while( true );
  if ((plVar11 == (lyd_node_inner *)node) && (match != (lyd_node *)0x0)) {
    LVar6 = lyd_diff_get_op((lyd_node *)plVar14,&cur_op);
    if ((LVar6 != LY_SUCCESS) || (cur_op != LYD_DIFF_OP_NONE)) {
      __assert_fail("!lyd_diff_get_op(diff_parent, &cur_op) && (cur_op == LYD_DIFF_OP_NONE)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x170,
                    "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                   );
    }
    plVar4 = (plVar14->field_0).node.schema;
    if (((plVar4 != (lysc_node *)0x0) && ((plVar4->nodetype & 0x18) != 0)) &&
       (plVar13 = plVar14, (plVar4->flags & 0x40) != 0)) {
      do {
        plVar11 = plVar13;
        plVar13 = (lyd_node_inner *)(plVar11->field_0).node.next;
        if (plVar13 == (lyd_node_inner *)0x0) break;
      } while ((plVar13->field_0).node.schema == plVar4);
      if ((plVar11 != plVar14) &&
         (LVar6 = lyd_insert_after((lyd_node *)plVar11,(lyd_node *)plVar14), LVar6 != LY_SUCCESS)) {
        return LVar6;
      }
    }
    lyd_diff_del_meta((lyd_node *)plVar14,"operation");
    plVar9 = lyd_child_no_keys((lyd_node *)plVar14);
    for (; op_00 = local_84, dup = (lyd_node *)plVar14, plVar9 != (lyd_node *)0x0;
        plVar9 = plVar9->next) {
      lyd_diff_find_meta(plVar9,"operation",&meta,(lyd_attr **)0x0);
      if ((meta == (lyd_meta *)0x0) &&
         (LVar6 = lyd_new_meta((ly_ctx *)0x0,plVar9,(lys_module *)0x0,"yang:operation","none",2,
                               (lyd_meta **)0x0), LVar6 != LY_SUCCESS)) {
        return LVar6;
      }
    }
  }
  else {
LAB_0011609c:
    if ((((local_84 == LYD_DIFF_OP_REPLACE) && (plVar4 = node->schema, plVar4 != (lysc_node *)0x0))
        && ((plVar4->nodetype & 0x18) != 0)) && ((plVar4->flags & 0x42) == 0x40)) {
      uVar7 = 0x4e;
    }
    else {
      uVar7 = 0x4f;
    }
    if (plVar14 == (lyd_node_inner *)0x0) {
      LVar6 = lyd_dup_single(node,(lyd_node_inner *)0x0,uVar7,&dup);
      op_00 = local_84;
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      if (dup == (lyd_node *)0x0) {
        plVar13 = (lyd_node_inner *)0x0;
      }
      else {
        plVar13 = dup->parent;
      }
      do {
        plVar14 = plVar13;
        if (plVar14 == (lyd_node_inner *)0x0) {
          lyd_diff_insert_sibling(*diff,dup,diff);
          goto LAB_00115f00;
        }
        plVar13 = *(lyd_node_inner **)((long)&plVar14->field_0 + 0x10);
      } while (*(lyd_node_inner **)((long)&plVar14->field_0 + 0x10) != (lyd_node_inner *)0x0);
LAB_001164ad:
      op_00 = local_84;
      lyd_diff_insert_sibling(*diff,(lyd_node *)plVar14,diff);
    }
    else {
      plVar4 = (plVar14->field_0).node.schema;
      if (plVar4 == (lysc_node *)0x0) {
        plVar12 = (lys_module *)&plVar14[1].field_0.node.priv;
      }
      else {
        plVar12 = plVar4->module;
      }
      LVar6 = lyd_dup_single_to_ctx(node,plVar12->ctx,plVar14,uVar7,&dup);
      plVar13 = (lyd_node_inner *)dup;
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      do {
        plVar14 = plVar13;
        plVar13 = *(lyd_node_inner **)((long)&plVar14->field_0 + 0x10);
        if (plVar13 == (lyd_node_inner *)0x0) goto LAB_001164ad;
        op_00 = local_84;
      } while ((plVar13->field_0).node.schema == (plVar11->field_0).node.schema);
    }
    if ((plVar14 != (lyd_node_inner *)dup) &&
       (LVar6 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)plVar14,(lys_module *)0x0,"yang:operation",
                             "none",2,(lyd_meta **)0x0), LVar6 != LY_SUCCESS)) {
      return LVar6;
    }
  }
LAB_00115f00:
  plVar9 = dup;
  pcVar10 = lyd_diff_op2str(op_00);
  LVar6 = lyd_new_meta((ly_ctx *)0x0,plVar9,(lys_module *)0x0,"yang:operation",pcVar10,2,
                       (lyd_meta **)0x0);
  if (LVar6 == LY_SUCCESS) {
    plVar13 = (lyd_node_inner *)dup;
    plVar14 = (lyd_node_inner *)dup;
    if (op_00 == LYD_DIFF_OP_CREATE) {
      while (plVar14 != (lyd_node_inner *)0x0) {
        if ((((plVar14 != plVar13) &&
             (plVar4 = (plVar14->field_0).node.schema, plVar4 != (lysc_node *)0x0)) &&
            (uVar2 = plVar4->nodetype, (uVar2 & 0x18) != 0)) &&
           (uVar3 = plVar4->flags, (uVar3 & 0x40) != 0)) {
          buflen = 0;
          bufused = 0;
          local_80 = (char *)0x0;
          if ((uVar2 == 0x10 & (byte)(uVar3 >> 9) & 1) == 0) {
            if (uVar2 == 0x10) {
              plVar9 = (plVar14->field_0).node.prev;
              name = "yang:key";
              pcVar10 = "";
              if (plVar9->next != (lyd_node *)0x0) {
                name = "yang:key";
                pcVar10 = "";
                if (plVar9->schema == plVar4) {
                  LVar6 = lyd_path_list_predicate(plVar9,&local_80,&buflen,&bufused,'\0');
                  if (LVar6 != LY_SUCCESS) goto LAB_001163b3;
                  name = "yang:key";
                  pcVar10 = local_80;
                }
              }
            }
            else {
              if ((uVar2 == 8) && ((uVar3 & 1) == 0)) goto LAB_001162ff;
              plVar9 = (plVar14->field_0).node.prev;
              name = "yang:value";
              pcVar10 = "";
              if (plVar9->next != (lyd_node *)0x0) {
                name = "yang:value";
                pcVar10 = "";
                if (plVar9->schema == plVar4) {
                  pcVar10 = lyd_get_value(plVar9);
                  name = "yang:value";
                }
              }
            }
LAB_0011639d:
            LVar6 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)plVar14,(lys_module *)0x0,name,pcVar10,2,
                                 (lyd_meta **)0x0);
          }
          else {
LAB_001162ff:
            uVar7 = lyd_list_pos((lyd_node *)plVar14);
            name = "yang:position";
            pcVar10 = "";
            if (uVar7 < 2) goto LAB_0011639d;
            iVar8 = asprintf(&local_80,"%u",(ulong)(uVar7 - 1));
            if (iVar8 != -1) {
              name = "yang:position";
              pcVar10 = local_80;
              goto LAB_0011639d;
            }
            plVar4 = (plVar14->field_0).node.schema;
            if (plVar4 == (lysc_node *)0x0) {
              plVar12 = (lys_module *)((long)&plVar14[1].field_0 + 0x30);
            }
            else {
              plVar12 = plVar4->module;
            }
            LVar6 = LY_EMEM;
            ly_log(plVar12->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyd_diff_add_create_nested_userord");
          }
LAB_001163b3:
          free(local_80);
          plVar13 = (lyd_node_inner *)dup;
          if (LVar6 != LY_SUCCESS) {
            return LVar6;
          }
        }
        plVar11 = (lyd_node_inner *)lyd_child((lyd_node *)plVar14);
        plVar15 = plVar14;
        if (plVar11 != (lyd_node_inner *)0x0) goto LAB_0011644e;
        if (plVar14 == plVar13) break;
        do {
          plVar11 = (lyd_node_inner *)(plVar15->field_0).node.next;
LAB_0011644e:
          plVar14 = plVar11;
        } while ((plVar11 == (lyd_node_inner *)0x0) &&
                (plVar15 = (plVar15->field_0).node.parent,
                (plVar15->field_0).node.parent != (plVar13->field_0).node.parent));
      }
    }
    if ((((((local_50 == (char *)0x0) ||
           (LVar6 = lyd_new_meta((ly_ctx *)0x0,dup,(lys_module *)0x0,"yang:orig-default",local_50,2,
                                 (lyd_meta **)0x0), LVar6 == LY_SUCCESS)) &&
          ((local_58 == (char *)0x0 ||
           (LVar6 = lyd_new_meta((ly_ctx *)0x0,dup,(lys_module *)0x0,"yang:orig-value",local_58,2,
                                 (lyd_meta **)0x0), LVar6 == LY_SUCCESS)))) &&
         ((local_60 == (char *)0x0 ||
          (LVar6 = lyd_new_meta((ly_ctx *)0x0,dup,(lys_module *)0x0,"yang:key",local_60,2,
                                (lyd_meta **)0x0), LVar6 == LY_SUCCESS)))) &&
        ((((local_68 == (char *)0x0 ||
           (LVar6 = lyd_new_meta((ly_ctx *)0x0,dup,(lys_module *)0x0,"yang:value",local_68,2,
                                 (lyd_meta **)0x0), LVar6 == LY_SUCCESS)) &&
          ((position == (char *)0x0 ||
           (LVar6 = lyd_new_meta((ly_ctx *)0x0,dup,(lys_module *)0x0,"yang:position",position,2,
                                 (lyd_meta **)0x0), LVar6 == LY_SUCCESS)))) &&
         ((orig_key == (char *)0x0 ||
          (LVar6 = lyd_new_meta((ly_ctx *)0x0,dup,(lys_module *)0x0,"yang:orig-key",orig_key,2,
                                (lyd_meta **)0x0), LVar6 == LY_SUCCESS)))))) &&
       ((orig_position == (char *)0x0 ||
        (LVar6 = lyd_new_meta((ly_ctx *)0x0,dup,(lys_module *)0x0,"yang:orig-position",orig_position
                              ,2,(lyd_meta **)0x0), LVar6 == LY_SUCCESS)))) {
      LVar6 = LY_SUCCESS;
    }
  }
  return LVar6;
}

Assistant:

LY_ERR
lyd_diff_add(const struct lyd_node *node, enum lyd_diff_op op, const char *orig_default, const char *orig_value,
        const char *key, const char *value, const char *position, const char *orig_key, const char *orig_position,
        struct lyd_node **diff)
{
    struct lyd_node *dup, *siblings, *match = NULL, *diff_parent = NULL, *elem;
    const struct lyd_node *parent = NULL;
    enum lyd_diff_op cur_op;
    struct lyd_meta *meta;
    uint32_t diff_opts;

    assert(diff);

    /* replace leaf always needs orig-default and orig-value */
    assert((node->schema->nodetype != LYS_LEAF) || (op != LYD_DIFF_OP_REPLACE) || (orig_default && orig_value));

    /* create on userord needs key/value */
    assert((node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) ||
            (lysc_is_dup_inst_list(node->schema) && position) || key);
    assert((node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) ||
            (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || value);

    /* move on userord needs both key and orig-key/value and orig-value */
    assert((node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) ||
            (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (key && orig_key));
    assert((node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) ||
            (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) ||
            (value && orig_value));

    /* find the first existing parent */
    siblings = *diff;
    do {
        /* find next node parent */
        parent = node;
        while (parent->parent && (!diff_parent || (parent->parent->schema != diff_parent->schema))) {
            parent = lyd_parent(parent);
        }

        if (lysc_is_dup_inst_list(parent->schema)) {
            /* assume it never exists, we are not able to distinguish whether it does or not */
            match = NULL;
            break;
        }

        /* check whether it exists in the diff */
        if (lyd_find_sibling_first(siblings, parent, &match)) {
            break;
        }

        /* another parent found */
        diff_parent = match;

        /* move down in the diff */
        siblings = lyd_child_no_keys(match);
    } while (parent != node);

    if (match && (parent == node)) {
        /* special case when there is already an operation on our descendant */
        assert(!lyd_diff_get_op(diff_parent, &cur_op) && (cur_op == LYD_DIFF_OP_NONE));
        (void)cur_op;

        /* move it to the end where it is expected (matters for user-ordered lists) */
        if (lysc_is_userordered(diff_parent->schema)) {
            for (elem = diff_parent; elem->next && (elem->next->schema == elem->schema); elem = elem->next) {}
            if (elem != diff_parent) {
                LY_CHECK_RET(lyd_insert_after(elem, diff_parent));
            }
        }

        /* will be replaced by the new operation but keep the current op for descendants */
        lyd_diff_del_meta(diff_parent, "operation");
        LY_LIST_FOR(lyd_child_no_keys(diff_parent), elem) {
            lyd_diff_find_meta(elem, "operation", &meta, NULL);
            if (meta) {
                /* explicit operation, fine */
                continue;
            }

            /* set the none operation */
            LY_CHECK_RET(lyd_new_meta(NULL, elem, NULL, "yang:operation", "none", LYD_NEW_VAL_STORE_ONLY, NULL));
        }

        dup = diff_parent;
    } else {
        diff_opts = LYD_DUP_NO_META | LYD_DUP_WITH_PARENTS | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS;
        if ((op != LYD_DIFF_OP_REPLACE) || !lysc_is_userordered(node->schema) || (node->schema->flags & LYS_CONFIG_R)) {
            /* move applies only to the user-ordered list, no descendants */
            diff_opts |= LYD_DUP_RECURSIVE;
        }

        /* duplicate the subtree (and connect to the diff if possible) */
        if (diff_parent) {
            LY_CHECK_RET(lyd_dup_single_to_ctx(node, LYD_CTX(diff_parent), (struct lyd_node_inner *)diff_parent,
                    diff_opts, &dup));
        } else {
            LY_CHECK_RET(lyd_dup_single(node, NULL, diff_opts, &dup));
        }

        /* find the first duplicated parent */
        if (!diff_parent) {
            diff_parent = lyd_parent(dup);
            while (diff_parent && diff_parent->parent) {
                diff_parent = lyd_parent(diff_parent);
            }
        } else {
            diff_parent = dup;
            while (diff_parent->parent && (diff_parent->parent->schema == parent->schema)) {
                diff_parent = lyd_parent(diff_parent);
            }
        }

        /* no parent existed, must be manually connected */
        if (!diff_parent) {
            /* there actually was no parent to duplicate */
            lyd_diff_insert_sibling(*diff, dup, diff);
        } else if (!diff_parent->parent) {
            lyd_diff_insert_sibling(*diff, diff_parent, diff);
        }

        /* add parent operation, if any */
        if (diff_parent && (diff_parent != dup)) {
            LY_CHECK_RET(lyd_new_meta(NULL, diff_parent, NULL, "yang:operation", "none", LYD_NEW_VAL_STORE_ONLY, NULL));
        }
    }

    /* add subtree operation */
    LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:operation", lyd_diff_op2str(op), LYD_NEW_VAL_STORE_ONLY, NULL));

    if (op == LYD_DIFF_OP_CREATE) {
        /* all nested user-ordered (leaf-)lists need special metadata for create op */
        LYD_TREE_DFS_BEGIN(dup, elem) {
            if ((elem != dup) && lysc_is_userordered(elem->schema)) {
                LY_CHECK_RET(lyd_diff_add_create_nested_userord(elem));
            }
            LYD_TREE_DFS_END(dup, elem);
        }
    }

    /* orig-default */
    if (orig_default) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-default", orig_default, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-value */
    if (orig_value) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-value", orig_value, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* key */
    if (key) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:key", key, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* value */
    if (value) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:value", value, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* position */
    if (position) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:position", position, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-key */
    if (orig_key) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-key", orig_key, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-position */
    if (orig_position) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-position", orig_position, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    return LY_SUCCESS;
}